

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool validate_integral_image
               (_func_void_float_ptr_integral_image_ptr *original_function,
               vector<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
               *test_functions,int width,int height,float *image,bool is_padded)

{
  undefined1 auVar1 [16];
  integral_image *__ptr;
  integral_image *__ptr_00;
  ulong uVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  ulong uVar8;
  undefined7 in_register_00000089;
  bool bVar9;
  undefined1 auVar10 [16];
  bool local_48;
  
  if ((int)CONCAT71(in_register_00000089,is_padded) == 0) {
    __ptr = create_integral_img(width,height);
  }
  else {
    __ptr = create_padded_integral_img(width,height);
  }
  (*original_function)(image,__ptr);
  if ((test_functions->
      super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (test_functions->
      super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_48 = true;
  }
  else {
    uVar5 = 0;
    local_48 = true;
    do {
      if (is_padded) {
        __ptr_00 = create_padded_integral_img(width,height);
      }
      else {
        __ptr_00 = create_integral_img(width,height);
      }
      (*(test_functions->
        super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar5])(image,__ptr_00);
      uVar2 = (ulong)__ptr->data_height;
      if (0 < (long)uVar2) {
        auVar10._8_4_ = 0x7fffffff;
        auVar10._0_8_ = 0x7fffffff7fffffff;
        auVar10._12_4_ = 0x7fffffff;
        uVar8 = (ulong)(uint)__ptr->data_width;
        pfVar3 = __ptr->padded_data;
        pfVar7 = __ptr_00->padded_data;
        uVar6 = 0;
        bVar9 = false;
        do {
          if (0 < __ptr->data_width) {
            uVar4 = 0;
            do {
              auVar1 = vandps_avx(ZEXT416((uint)(pfVar3[uVar4] - pfVar7[uVar4])),auVar10);
              if (1e-06 < auVar1._0_4_) {
                printf("DIFFERENCE: (%i, %i) original: %f, optimized: %f\n",(double)pfVar3[uVar4],
                       (double)pfVar7[uVar4]);
                if (!bVar9) {
                  local_48 = false;
                  printf("Error: compute_integral_img() test function %d does not match original function.\n"
                         ,uVar5 & 0xffffffff);
                }
                goto LAB_001909f3;
              }
              uVar4 = uVar4 + 1;
            } while (uVar8 != uVar4);
          }
          uVar6 = uVar6 + 1;
          pfVar7 = pfVar7 + uVar8;
          pfVar3 = pfVar3 + uVar8;
          bVar9 = uVar2 <= uVar6;
        } while (uVar6 != uVar2);
      }
LAB_001909f3:
      free(__ptr_00->padded_data);
      free(__ptr_00);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(test_functions->
                                   super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(test_functions->
                                   super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  free(__ptr->padded_data);
  free(__ptr);
  return local_48;
}

Assistant:

bool validate_integral_image(void (*original_function)(float *, struct integral_image *),
                             const std::vector<void (*)(float *, struct integral_image *)> &test_functions, int width,
                             int height, float *image, bool is_padded) {

    // Checking if original integral image should be padded and initializing it   
    struct integral_image *original_iimage;
    if (!is_padded) {
        original_iimage = create_integral_img(width, height);
    } else {
        original_iimage = create_padded_integral_img(width, height);
    }

    // Compute original integral image
    original_function(image, original_iimage);
    
    bool all_functions_equal = true;

    // Iterating through all test functions
    for (int j = 0; j < test_functions.size(); ++j) {
        
        // Checking if optimized integral image should be padded and initializing it   
        struct integral_image *optimized_iimage;
        if (!is_padded) {
            optimized_iimage = create_integral_img(width, height);
        } else {
            optimized_iimage = create_padded_integral_img(width, height);
        }
        
        // Compute optimized integral image of optimized test function j 
        test_functions[j](image, optimized_iimage);

        if (!are_float_matrices_equal(original_iimage->padded_data, 
                                      optimized_iimage->padded_data, 
                                      original_iimage->data_width, 
                                      original_iimage->data_height)) {
            all_functions_equal = false;
            printf("Error: compute_integral_img() test function %d does not match original function.\n", j);
        }

        free(optimized_iimage->padded_data);
        free(optimized_iimage);
    }

    free(original_iimage->padded_data);
    free(original_iimage);

    return all_functions_equal;

}